

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverImpl.cpp
# Opt level: O0

Bool __thiscall
Diligent::ArchiverImpl::SerializeToStream
          (ArchiverImpl *this,Uint32 ContentVersion,IFileStream *pStream)

{
  undefined8 uVar1;
  Bool BVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  Char *Message;
  IDataBlob **ppBlob;
  IDataBlob *pIVar6;
  DoublePtrHelper<Diligent::IDataBlob> local_70;
  RefCntAutoPtr<Diligent::IDataBlob> local_60;
  RefCntAutoPtr<Diligent::IDataBlob> pDataBlob;
  undefined1 local_48 [8];
  string msg;
  IFileStream *pStream_local;
  Uint32 ContentVersion_local;
  ArchiverImpl *this_local;
  
  msg.field_2._8_8_ = pStream;
  if (pStream == (IFileStream *)0x0) {
    FormatString<char[25]>((string *)local_48,(char (*) [25])"pStream must not be null");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"SerializeToStream",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverImpl.cpp"
               ,0xf6);
    std::__cxx11::string::~string((string *)local_48);
  }
  if (msg.field_2._8_8_ == 0) {
    this_local._7_1_ = false;
  }
  else {
    RefCntAutoPtr<Diligent::IDataBlob>::RefCntAutoPtr(&local_60);
    RefCntAutoPtr<Diligent::IDataBlob>::operator&((RefCntAutoPtr<Diligent::IDataBlob> *)&local_70);
    ppBlob = Diligent::RefCntAutoPtr::DoublePtrHelper::operator_cast_to_IDataBlob__
                       ((DoublePtrHelper *)&local_70);
    BVar2 = SerializeToBlob(this,ContentVersion,ppBlob);
    RefCntAutoPtr<Diligent::IDataBlob>::DoublePtrHelper<Diligent::IDataBlob>::~DoublePtrHelper
              (&local_70);
    uVar1 = msg.field_2._8_8_;
    if (((BVar2 ^ 0xffU) & 1) == 0) {
      pIVar6 = RefCntAutoPtr<Diligent::IDataBlob>::operator->(&local_60);
      iVar4 = (*(pIVar6->super_IObject)._vptr_IObject[7])(pIVar6,0);
      pIVar6 = RefCntAutoPtr<Diligent::IDataBlob>::operator->(&local_60);
      iVar5 = (*(pIVar6->super_IObject)._vptr_IObject[5])();
      bVar3 = (**(code **)(*(long *)uVar1 + 0x30))(uVar1,iVar4,iVar5);
      this_local._7_1_ = (Bool)(bVar3 & 1);
    }
    else {
      this_local._7_1_ = false;
    }
    RefCntAutoPtr<Diligent::IDataBlob>::~RefCntAutoPtr(&local_60);
  }
  return this_local._7_1_;
}

Assistant:

Bool ArchiverImpl::SerializeToStream(Uint32 ContentVersion, IFileStream* pStream)
{
    DEV_CHECK_ERR(pStream != nullptr, "pStream must not be null");
    if (pStream == nullptr)
        return false;

    RefCntAutoPtr<IDataBlob> pDataBlob;
    if (!SerializeToBlob(ContentVersion, &pDataBlob))
        return false;

    return pStream->Write(pDataBlob->GetConstDataPtr(), pDataBlob->GetSize());
}